

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O0

void __thiscall
Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::PartialPivLU
          (PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,MatrixType *matrix)

{
  Index IVar1;
  Index local_28;
  Index local_20;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_18;
  MatrixType *matrix_local;
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  local_18 = &matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  matrix_local = &this->m_lu;
  local_20 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                       (&matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  local_28 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18);
  Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)this,&local_20,&local_28);
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18);
  PermutationMatrix<-1,_-1,_int>::PermutationMatrix(&this->m_p,(int)IVar1);
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18);
  Transpositions<-1,_-1,_int>::Transpositions(&this->m_rowsTranspositions,(Index)IVar1);
  this->m_det_p = 0;
  this->m_isInitialized = false;
  compute(this,(MatrixType *)local_18);
  return;
}

Assistant:

PartialPivLU<MatrixType>::PartialPivLU(const MatrixType& matrix)
  : m_lu(matrix.rows(), matrix.rows()),
    m_p(matrix.rows()),
    m_rowsTranspositions(matrix.rows()),
    m_det_p(0),
    m_isInitialized(false)
{
  compute(matrix);
}